

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_threadprivate.cpp
# Opt level: O1

void kmp_threadprivate_insert_private_data(int gtid,void *pc_addr,void *data_addr,size_t pc_size)

{
  long *plVar1;
  private_data *ppVar2;
  long *plVar3;
  
  plVar3 = (long *)((long)__kmp_threadprivate_d_table.data + (ulong)((uint)pc_addr & 0xff8));
  plVar1 = plVar3;
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == (long *)0x0) goto LAB_00144209;
  } while ((void *)plVar1[3] != pc_addr);
  if (plVar1 != (long *)0x0) {
    return;
  }
LAB_00144209:
  plVar1 = (long *)___kmp_allocate(0x50);
  plVar1[3] = (long)pc_addr;
  ppVar2 = __kmp_init_common_data(data_addr,pc_size);
  plVar1[1] = (long)ppVar2;
  plVar1[9] = pc_size;
  __kmp_acquire_ticket_lock(&__kmp_global_lock,gtid);
  *plVar1 = *plVar3;
  *plVar3 = (long)plVar1;
  __kmp_release_ticket_lock(&__kmp_global_lock,gtid);
  return;
}

Assistant:

void kmp_threadprivate_insert_private_data(int gtid, void *pc_addr,
                                           void *data_addr, size_t pc_size) {
  struct shared_common **lnk_tn, *d_tn;
  KMP_DEBUG_ASSERT(__kmp_threads[gtid] &&
                   __kmp_threads[gtid]->th.th_root->r.r_active == 0);

  d_tn = __kmp_find_shared_task_common(&__kmp_threadprivate_d_table, gtid,
                                       pc_addr);

  if (d_tn == 0) {
    d_tn = (struct shared_common *)__kmp_allocate(sizeof(struct shared_common));

    d_tn->gbl_addr = pc_addr;
    d_tn->pod_init = __kmp_init_common_data(data_addr, pc_size);
    /*
            d_tn->obj_init = 0;  // AC: commented out because __kmp_allocate
       zeroes the memory
            d_tn->ct.ctor = 0;
            d_tn->cct.cctor = 0;;
            d_tn->dt.dtor = 0;
            d_tn->is_vec = FALSE;
            d_tn->vec_len = 0L;
    */
    d_tn->cmn_size = pc_size;

    __kmp_acquire_lock(&__kmp_global_lock, gtid);

    lnk_tn = &(__kmp_threadprivate_d_table.data[KMP_HASH(pc_addr)]);

    d_tn->next = *lnk_tn;
    *lnk_tn = d_tn;

    __kmp_release_lock(&__kmp_global_lock, gtid);
  }
}